

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.c
# Opt level: O1

Ray * perspective_camera_ray(Ray *__return_storage_ptr__,PerspectiveCamera cam,float sx,float sy)

{
  float fVar1;
  float fVar2;
  Vec3 VVar3;
  Vec3 v;
  
  VVar3.x = (sx + sx + -1.0) * cam.xscale;
  fVar2 = (sy + sy + -1.0) * cam.yscale;
  VVar3.z = -cam.depth;
  VVar3.y = fVar2;
  fVar1 = norm(VVar3);
  v.z = VVar3.z / fVar1;
  (__return_storage_ptr__->o).x = cam.eye.x;
  (__return_storage_ptr__->o).y = cam.eye.y;
  (__return_storage_ptr__->o).z = cam.eye.z;
  v.y = fVar2 / fVar1;
  v.x = VVar3.x / fVar1;
  VVar3 = basis2world(v,cam.basis[0],cam.basis[1],cam.basis[2]);
  (__return_storage_ptr__->d).x = (float)(int)VVar3._0_8_;
  (__return_storage_ptr__->d).y = (float)(int)((ulong)VVar3._0_8_ >> 0x20);
  (__return_storage_ptr__->d).z = VVar3.z;
  return __return_storage_ptr__;
}

Assistant:

Ray perspective_camera_ray(PerspectiveCamera cam, float sx, float sy) {
    Vec3 basis_ray = normalized(
        (Vec3){ cam.xscale * (-1.0f + 2.0f * sx),
                cam.yscale * (-1.0f + 2.0f * sy),
                -cam.depth
                }
        );
    Ray r = {
        .o = cam.eye,
        .d = basis2world(
            basis_ray,
            cam.basis[0], cam.basis[1], cam.basis[2]
            )
    };
    return r;
}